

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::OnCreateConflict>
          (Serializer *this,field_id_t field_id,char *tag,OnCreateConflict *value,
          OnCreateConflict *default_value)

{
  byte bVar1;
  
  if (((this->options).serialize_default_values == false) && (*value == *default_value)) {
    bVar1 = 0;
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<duckdb::OnCreateConflict>(this,*value);
    bVar1 = 1;
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}